

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionReport.h
# Opt level: O0

void __thiscall
FIX42::ExecutionReport::ExecutionReport
          (ExecutionReport *this,OrderID *aOrderID,ExecID *aExecID,ExecTransType *aExecTransType,
          ExecType *aExecType,OrdStatus *aOrdStatus,Symbol *aSymbol,Side *aSide,
          LeavesQty *aLeavesQty,CumQty *aCumQty,AvgPx *aAvgPx)

{
  MsgType local_90;
  OrdStatus *local_38;
  OrdStatus *aOrdStatus_local;
  ExecType *aExecType_local;
  ExecTransType *aExecTransType_local;
  ExecID *aExecID_local;
  OrderID *aOrderID_local;
  ExecutionReport *this_local;
  
  local_38 = aOrdStatus;
  aOrdStatus_local = (OrdStatus *)aExecType;
  aExecType_local = (ExecType *)aExecTransType;
  aExecTransType_local = (ExecTransType *)aExecID;
  aExecID_local = (ExecID *)aOrderID;
  aOrderID_local = (OrderID *)this;
  MsgType();
  FIX42::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__ExecutionReport_0017c878;
  set(this,(OrderID *)aExecID_local);
  set(this,(ExecID *)aExecTransType_local);
  set(this,(ExecTransType *)aExecType_local);
  set(this,(ExecType *)aOrdStatus_local);
  set(this,local_38);
  set(this,aSymbol);
  set(this,aSide);
  set(this,aLeavesQty);
  set(this,aCumQty);
  set(this,aAvgPx);
  return;
}

Assistant:

ExecutionReport(
      const FIX::OrderID& aOrderID,
      const FIX::ExecID& aExecID,
      const FIX::ExecTransType& aExecTransType,
      const FIX::ExecType& aExecType,
      const FIX::OrdStatus& aOrdStatus,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::LeavesQty& aLeavesQty,
      const FIX::CumQty& aCumQty,
      const FIX::AvgPx& aAvgPx )
    : Message(MsgType())
    {
      set(aOrderID);
      set(aExecID);
      set(aExecTransType);
      set(aExecType);
      set(aOrdStatus);
      set(aSymbol);
      set(aSide);
      set(aLeavesQty);
      set(aCumQty);
      set(aAvgPx);
    }